

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O2

void operator_delete__(void *p)

{
  tcmalloc::InvokeDeleteHook(p);
  DebugDeallocate(p,-0x4315208e,0);
  return;
}

Assistant:

PERFTOOLS_DLL_DECL void tc_deletearray(void* p) PERFTOOLS_NOTHROW {
  tcmalloc::InvokeDeleteHook(p);
  DebugDeallocate(p, MallocBlock::kArrayNewType, 0);
  force_frame();
}